

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

uint64_t anon_unknown.dwarf_1f0a16::PolyMod(uint64_t c,int val)

{
  ulong uVar1;
  int in_ESI;
  ulong in_RDI;
  long in_FS_OFFSET;
  uint8_t c0;
  undefined8 local_10;
  
  uVar1 = in_RDI >> 0x23;
  local_10 = (in_RDI & 0x7ffffffff) << 5 ^ (long)in_ESI;
  if ((uVar1 & 1) != 0) {
    local_10 = local_10 ^ 0xf5dee51989;
  }
  if ((uVar1 & 2) != 0) {
    local_10 = local_10 ^ 0xa9fdca3312;
  }
  if ((uVar1 & 4) != 0) {
    local_10 = local_10 ^ 0x1bab10e32d;
  }
  if ((uVar1 & 8) != 0) {
    local_10 = local_10 ^ 0x3706b1677a;
  }
  if ((uVar1 & 0x10) != 0) {
    local_10 = local_10 ^ 0x644d626ffd;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t PolyMod(uint64_t c, int val)
{
    uint8_t c0 = c >> 35;
    c = ((c & 0x7ffffffff) << 5) ^ val;
    if (c0 & 1) c ^= 0xf5dee51989;
    if (c0 & 2) c ^= 0xa9fdca3312;
    if (c0 & 4) c ^= 0x1bab10e32d;
    if (c0 & 8) c ^= 0x3706b1677a;
    if (c0 & 16) c ^= 0x644d626ffd;
    return c;
}